

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToDoubleOctalString(void)

{
  ulong in_RAX;
  bool *pbVar1;
  bool *pbVar2;
  int in_R9D;
  double dVar3;
  bool all_used;
  ulong uStack_38;
  int processed;
  
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  uStack_38 = in_RAX;
  dVar3 = StrToD("012",0x3a,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb38,0xc14b95,"StrToD(\"012\", flags, 0.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xb39,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb3b,0xc0f3ce,"StrToD(\"00\", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb3c,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb3e,0xc14b95,"StrToD(\"012\", flags, 1.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xb3f,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb42,0xc14c2c,
                    "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xb43,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb46,0xc14d06,
                    "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb47,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb4a,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb4b,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb4e,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb4f,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",0x3a,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb51,0xc14b95,"StrToD(\" 012\", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb52,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("\n012",0x3a,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb54,0xc14b95,"StrToD(\"\\n012\", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb55,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb57,0xc0f3ce,"StrToD(\" 00\", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb58,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("\t00",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb5a,0xc0f3ce,"StrToD(\"\\t00\", flags, 1.0, &processed, &all_used)",
                    0.0,pbVar1,dVar3);
  CheckHelper((char *)0xb5b,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb5d,0xc14b95,"StrToD(\" 012\", flags, 1.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb5e,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("\n012",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb60,0xc14b95,"StrToD(\"\\n012\", flags, 1.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb61,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb64,0xc14c2c,
                    "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xb65,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb68,0xc14d06,
                    "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb69,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("\n01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb6c,0xc14d06,
                    "StrToD(\"\\n01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb6d,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb70,0xc14d06,
                    "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb71,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb74,0xc14d05,
                    "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xb75,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("\n-\t01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb78,0xc14d05,
                    "StrToD(\"\\n-\\t01234567\", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar1,dVar3);
  CheckHelper((char *)0xb79,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",0x3a,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb7b,0xc14b95,"StrToD(\" 012 \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb7c,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00 ",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb7e,0xc0f3ce,"StrToD(\" 00 \", flags, 1.0, &processed, &all_used)",0.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xb7f,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb81,0xc14b95,"StrToD(\" 012 \", flags, 1.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb82,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb85,0xc14c2c,
                    "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xb86,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb89,0xc14d06,
                    "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb8a,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb8d,0xc14d06,
                    "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)",342391.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xb8e,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb91,0xc14d05,
                    "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar1,dVar3);
  CheckHelper((char *)0xb92,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",0x3a,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb94,0xc14b95,"StrToD(\"012 \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb95,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 ",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb97,0xc0f3ce,"StrToD(\"00 \", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xb98,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",0x3a,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb9a,0xc14b95,"StrToD(\"012 \", flags, 1.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xb9b,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xb9e,0xc14c2c,
                    "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xb9f,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 ",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xba2,0xc14d06,
                    "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xba3,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xba6,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xba7,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbaa,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xbab,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567e0",0x3a,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbae,0xc131a7,
                    "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1
                    ,dVar3);
  CheckEqualsHelper((char *)0xbaf,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",2,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbb3,0xc14b95,"StrToD(\"012\", flags, 0.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xbb4,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbb6,0xc0f3ce,"StrToD(\"00\", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xbb7,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbb9,0xc14b95,"StrToD(\"012\", flags, 1.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xbba,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbbd,0xc14c2c,
                    "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xbbe,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbc1,0xc14d06,
                    "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xbc2,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbc5,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xbc6,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbc9,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xbca,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",2,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbcc,0xc131a7,"StrToD(\" 012\", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbcd,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbcf,0xc131a7,"StrToD(\" 00\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbd0,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbd2,0xc131a7,"StrToD(\" 012\", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbd3,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbd6,0xc131a7,
                    "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbd7,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbda,0xc131a7,
                    "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1,
                    dVar3);
  CheckEqualsHelper((char *)0xbdb,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbde,0xc131a7,
                    "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbdf,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbe2,0xc131a7,
                    "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbe3,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",2,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbe5,0xc131a7,"StrToD(\" 012 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbe6,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00 ",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbe8,0xc131a7,"StrToD(\" 00 \", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbe9,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbeb,0xc131a7,"StrToD(\" 012 \", flags, 1.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbec,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbef,0xc131a7,
                    "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbf0,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbf3,0xc131a7,
                    "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1
                    ,dVar3);
  CheckEqualsHelper((char *)0xbf4,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbf7,0xc131a7,
                    "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbf8,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbfb,0xc131a7,
                    "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbfc,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",2,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xbfe,0xc131a7,"StrToD(\"012 \", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xbff,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 ",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc01,0xc131a7,"StrToD(\"00 \", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc02,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",2,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc04,0xc131a7,"StrToD(\"012 \", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc05,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc08,0xc131a7,
                    "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc09,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 ",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc0c,0xc131a7,
                    "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1,
                    dVar3);
  CheckEqualsHelper((char *)0xc0d,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc10,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc11,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc14,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc15,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567e0",2,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc18,0xc131a7,
                    "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1
                    ,dVar3);
  CheckEqualsHelper((char *)0xc19,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc1e,0xc14b95,"StrToD(\"012\", flags, 0.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xc1f,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc21,0xc0f3ce,"StrToD(\"00\", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc22,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc24,0xc14b95,"StrToD(\"012\", flags, 1.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xc25,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc28,0xc14c2c,
                    "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xc29,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc2c,0xc14d06,
                    "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc2d,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc30,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc31,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc34,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc35,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc37,0xc131a7,"StrToD(\" 012\", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc38,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc3a,0xc131a7,"StrToD(\" 00\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc3b,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc3d,0xc131a7,"StrToD(\" 012\", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc3e,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc41,0xc131a7,
                    "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc42,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc45,0xc131a7,
                    "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1,
                    dVar3);
  CheckEqualsHelper((char *)0xc46,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc49,0xc131a7,
                    "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc4a,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc4d,0xc131a7,
                    "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc4e,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc50,0xc131a7,"StrToD(\" 012 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc51,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00 ",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc53,0xc131a7,"StrToD(\" 00 \", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc54,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc56,0xc131a7,"StrToD(\" 012 \", flags, 1.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc57,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc5a,0xc131a7,
                    "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc5b,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc5e,0xc131a7,
                    "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1
                    ,dVar3);
  CheckEqualsHelper((char *)0xc5f,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc62,0xc131a7,
                    "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc63,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc66,0xc131a7,
                    "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc67,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc69,0xc14b95,"StrToD(\"012 \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc6a,0xc13999,(char *)0x3,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 ",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc6c,0xc0f3ce,"StrToD(\"00 \", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc6d,0xc172d3,(char *)0x2,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc70,0xc14c2c,
                    "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc71,0xc0df13,(char *)0xa,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc74,0xc14d06,
                    "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc75,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc78,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc79,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc7c,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xc7d,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012foo ",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc7f,0xc14b95,"StrToD(\"012foo \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc80,0xc13999,(char *)0x3,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00foo ",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc82,0xc0f3ce,"StrToD(\"00foo \", flags, 1.0, &processed, &all_used)",
                    0.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc83,0xc172d3,(char *)0x2,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789foo ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc87,0xc14c2c,
                    "StrToD(\"0123456789foo \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc88,0xc0df13,(char *)0xa,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567foo ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc8b,0xc14d06,
                    "StrToD(\"01234567foo \", flags, Double::NaN(), &processed, &all_used)",342391.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc8c,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567foo",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc8f,0xc14d06,
                    "StrToD(\"+01234567foo\", flags, Double::NaN(), &processed, &all_used)",342391.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc90,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567foo",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc93,0xc14d05,
                    "StrToD(\"-01234567foo\", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc94,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 foo ",6,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc96,0xc14b95,"StrToD(\"012 foo \", flags, 0.0, &processed, &all_used)"
                    ,10.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc97,0xc13999,(char *)0x3,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 foo ",6,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc99,0xc0f3ce,"StrToD(\"00 foo \", flags, 1.0, &processed, &all_used)",
                    0.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc9a,0xc172d3,(char *)0x2,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 foo ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xc9e,0xc14c2c,
                    "StrToD(\"0123456789 foo \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xc9f,0xc0df13,(char *)0xa,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 foo ",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xca3,0xc14d06,
                    "StrToD(\"01234567 foo \", flags, Double::NaN(), &processed, &all_used)",
                    342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xca4,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567 foo",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xca8,0xc14d06,
                    "StrToD(\"+01234567 foo\", flags, Double::NaN(), &processed, &all_used)",
                    342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xca9,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567 foo",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcad,0xc14d05,
                    "StrToD(\"-01234567 foo\", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcae,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567e0",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcb1,0xc14d06,
                    "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcb2,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567e",6,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcb5,0xc14d06,
                    "StrToD(\"01234567e\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcb6,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcbb,0xc14b95,"StrToD(\"012\", flags, 0.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xcbc,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcbe,0xc0f3ce,"StrToD(\"00\", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xcbf,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcc1,0xc14b95,"StrToD(\"012\", flags, 1.0, &processed, &all_used)",10.0
                    ,pbVar1,dVar3);
  CheckHelper((char *)0xcc2,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcc5,0xc14c2c,
                    "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xcc6,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcc9,0xc14d06,
                    "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xcca,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xccd,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xcce,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcd1,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xcd2,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcd4,0xc131a7,"StrToD(\" 012\", flags, 0.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcd5,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcd7,0xc131a7,"StrToD(\" 00\", flags, 1.0, &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcd8,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcda,0xc131a7,"StrToD(\" 012\", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcdb,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcde,0xc131a7,
                    "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcdf,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  dVar3 = StrToD(" 01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xce2,0xc131a7,
                    "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar2,
                    dVar3);
  CheckEqualsHelper((char *)0xce3,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar3 = StrToD(" + 01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xce6,0xc131a7,
                    "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar2,dVar3);
  CheckEqualsHelper((char *)0xce7,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcea,0xc131a7,
                    "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xceb,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xced,0xc131a7,"StrToD(\" 012 \", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcee,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 00 ",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcf0,0xc131a7,"StrToD(\" 00 \", flags, 1.0, &processed, &all_used)",NAN
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcf1,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 012 ",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcf3,0xc131a7,"StrToD(\" 012 \", flags, 1.0, &processed, &all_used)",
                    NAN,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcf4,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 0123456789 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcf7,0xc131a7,
                    "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xcf8,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" 01234567 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcfb,0xc131a7,
                    "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,pbVar1
                    ,dVar3);
  CheckEqualsHelper((char *)0xcfc,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" + 01234567 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xcff,0xc131a7,
                    "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd00,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD(" - 01234567 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd03,0xc131a7,
                    "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)",NAN,
                    pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd04,0xc166fe,(char *)0x0,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 ",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd06,0xc14b95,"StrToD(\"012 \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckHelper((char *)0xd07,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 ",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd09,0xc0f3ce,"StrToD(\"00 \", flags, 1.0, &processed, &all_used)",0.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xd0a,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd0d,0xc14c2c,
                    "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckHelper((char *)0xd0e,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd11,0xc14d06,
                    "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xd12,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd15,0xc14d06,
                    "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)",342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xd16,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd19,0xc14d05,
                    "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)",-342391.0,
                    pbVar1,dVar3);
  CheckHelper((char *)0xd1a,0xc13064,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar3 = StrToD("012foo ",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd1c,0xc14b95,"StrToD(\"012foo \", flags, 0.0, &processed, &all_used)",
                    10.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd1d,0xc13999,(char *)0x3,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00foo ",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd1f,0xc0f3ce,"StrToD(\"00foo \", flags, 1.0, &processed, &all_used)",
                    0.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd20,0xc172d3,(char *)0x2,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789foo ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd24,0xc14c2c,
                    "StrToD(\"0123456789foo \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd25,0xc0df13,(char *)0xa,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567foo ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd28,0xc14d06,
                    "StrToD(\"01234567foo \", flags, Double::NaN(), &processed, &all_used)",342391.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd29,0xc12b84,(char *)0x8,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567foo",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd2c,0xc14d06,
                    "StrToD(\"+01234567foo\", flags, Double::NaN(), &processed, &all_used)",342391.0
                    ,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd2d,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("-01234567foo",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd30,0xc14d05,
                    "StrToD(\"-01234567foo\", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd31,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("012 foo ",0x16,0.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd33,0xc14b95,"StrToD(\"012 foo \", flags, 0.0, &processed, &all_used)"
                    ,10.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd34,0xc17291,(char *)0x4,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("00 foo ",0x16,1.0,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd36,0xc0f3ce,"StrToD(\"00 foo \", flags, 1.0, &processed, &all_used)",
                    0.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd37,0xc13999,(char *)0x3,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("0123456789 foo ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd3b,0xc14c2c,
                    "StrToD(\"0123456789 foo \", flags, Double::NaN(), &processed, &all_used)",
                    123456789.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd3c,0xc1c295,(char *)0xb,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("01234567 foo ",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd40,0xc14d06,
                    "StrToD(\"01234567 foo \", flags, Double::NaN(), &processed, &all_used)",
                    342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd41,0xc16455,(char *)0x9,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar3 = StrToD("+01234567 foo",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd45,0xc14d06,
                    "StrToD(\"+01234567 foo\", flags, Double::NaN(), &processed, &all_used)",
                    342391.0,pbVar1,dVar3);
  CheckEqualsHelper((char *)0xd46,0xc0df13,(char *)0xa,0xc131e4,(char *)(uStack_38 >> 0x20),in_R9D);
  dVar3 = StrToD("-01234567 foo",0x16,NAN,&processed,pbVar2,0);
  CheckEqualsHelper((char *)0xd4a,0xc14d05,
                    "StrToD(\"-01234567 foo\", flags, Double::NaN(), &processed, &all_used)",
                    -342391.0,pbVar2,dVar3);
  CheckEqualsHelper((char *)0xd4b,0xc0df13,(char *)0xa,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  return;
}

Assistant:

TEST(StringToDoubleOctalString) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("\t00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("\n01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("\n-\t01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(), &processed,
                  &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(11, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);
}